

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

void __thiscall FIXT11::Message::Message(Message *this,MsgType *msgtype)

{
  allocator<char> local_91;
  STRING local_90;
  FieldBase local_70;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"FIXT.1.1",&local_91);
  FIX::BeginString::BeginString((BeginString *)&local_70,&local_90);
  FIX::Message::Message(&this->super_Message,(BeginString *)&local_70,msgtype);
  FIX::FieldBase::~FieldBase(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  *(undefined ***)this = &PTR__Message_002fd998;
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIXT.1.1"), msgtype )
     {}